

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileStorageCommitState::AddRowGroupData
          (SingleFileStorageCommitState *this,DataTable *table,idx_t start_index,idx_t count,
          unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
          *row_group_data)

{
  long *plVar1;
  undefined8 uVar2;
  vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_> *pvVar3;
  bool bVar4;
  pointer this_00;
  DataTableInfo *pDVar5;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>,std::allocator<std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var6;
  InternalException *this_01;
  ulong uVar7;
  __hash_code __code;
  long *plVar8;
  long *plVar9;
  undefined1 local_68 [32];
  idx_t local_48;
  idx_t local_40;
  vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_> *local_38;
  
  this_00 = unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
            ::operator->(row_group_data);
  bVar4 = PersistentCollectionData::HasUpdates(this_00);
  if (!bVar4) {
    pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&table->info);
    bVar4 = TableIndexList::Empty(&pDVar5->indexes);
    if (bVar4) {
      local_68._0_8_ = table;
      p_Var6 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>,std::allocator<std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)::std::__detail::
                  _Map_base<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->optimistically_written_data,(key_type *)local_68);
      uVar7 = start_index % *(ulong *)(p_Var6 + 8);
      plVar8 = *(long **)(*(long *)p_Var6 + uVar7 * 8);
      plVar9 = (long *)0x0;
      if ((plVar8 != (long *)0x0) &&
         (plVar1 = (long *)*plVar8, plVar9 = plVar8, ((long *)*plVar8)[1] != start_index)) {
        while (plVar8 = plVar1, plVar1 = (long *)*plVar8, plVar1 != (long *)0x0) {
          plVar9 = (long *)0x0;
          if (((ulong)plVar1[1] % *(ulong *)(p_Var6 + 8) != uVar7) ||
             (plVar9 = plVar8, plVar1[1] == start_index)) goto LAB_011429a4;
        }
        plVar9 = (long *)0x0;
      }
LAB_011429a4:
      if ((plVar9 != (long *)0x0) && (*plVar9 != 0)) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68._0_8_ = local_68 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,
                   "FIXME: AddOptimisticallyWrittenRowGroup is writing a duplicate row group","");
        InternalException::InternalException(this_01,(string *)local_68);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_68._24_8_ =
           (row_group_data->
           super_unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PersistentCollectionData_*,_std::default_delete<duckdb::PersistentCollectionData>_>
           .super__Head_base<0UL,_duckdb::PersistentCollectionData_*,_false>._M_head_impl;
      (row_group_data->
      super_unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PersistentCollectionData_*,_std::default_delete<duckdb::PersistentCollectionData>_>
      .super__Head_base<0UL,_duckdb::PersistentCollectionData_*,_false>._M_head_impl =
           (PersistentCollectionData *)0x0;
      local_38 = (vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                  *)0x0;
      local_68._0_8_ = start_index;
      local_68._8_8_ = start_index;
      local_68._16_8_ = count;
      local_48 = start_index;
      local_40 = count;
      ::std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>,std::allocator<std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long,duckdb::OptimisticallyWrittenRowGroupData>>
                (p_Var6,local_68);
      uVar2 = local_68._24_8_;
      if ((PersistentCollectionData *)local_68._24_8_ != (PersistentCollectionData *)0x0) {
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        ~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 *)local_68._24_8_);
        operator_delete((void *)uVar2);
      }
      pvVar3 = local_38;
      local_68._24_8_ = 0;
      if (local_38 !=
          (vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_> *
          )0x0) {
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        ~vector(local_38);
        operator_delete(pvVar3);
      }
    }
  }
  return;
}

Assistant:

void SingleFileStorageCommitState::AddRowGroupData(DataTable &table, idx_t start_index, idx_t count,
                                                   unique_ptr<PersistentCollectionData> row_group_data) {
	if (row_group_data->HasUpdates()) {
		// cannot serialize optimistic block pointers if in-memory updates exist
		return;
	}
	if (table.HasIndexes()) {
		// cannot serialize optimistic block pointers if the table has indexes
		return;
	}
	auto &entries = optimistically_written_data[table];
	auto entry = entries.find(start_index);
	if (entry != entries.end()) {
		throw InternalException("FIXME: AddOptimisticallyWrittenRowGroup is writing a duplicate row group");
	}
	entries.insert(
	    make_pair(start_index, OptimisticallyWrittenRowGroupData(start_index, count, std::move(row_group_data))));
}